

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O1

void UnitTest::CheckArray2DClose<float[2][2],float_const*const*,float>
               (TestResults *results,float (*expected) [2] [2],float ***actual,int rows,int columns,
               float *tolerance,TestDetails *details)

{
  float fVar1;
  bool bVar2;
  byte bVar3;
  ostream *poVar4;
  char *failure;
  ulong uVar5;
  ulong uVar6;
  int expectedRow;
  ulong uVar7;
  float (*pafVar8) [2];
  ulong uVar9;
  MemoryOutStream stream;
  undefined1 local_1c8 [408];
  
  if (0 < rows) {
    uVar6 = (ulong)(uint)columns;
    bVar2 = true;
    uVar5 = 0;
    pafVar8 = *expected;
    do {
      bVar3 = 1;
      if (0 < columns) {
        uVar9 = 0;
        do {
          fVar1 = (*(float (*) [2])*pafVar8)[uVar9];
          bVar3 = bVar3 & ((*actual)[uVar5][uVar9] <= *tolerance + fVar1 &&
                          fVar1 - *tolerance <= (*actual)[uVar5][uVar9]);
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
      }
      bVar2 = (bool)(bVar2 & bVar3);
      uVar5 = uVar5 + 1;
      pafVar8 = pafVar8 + 1;
    } while (uVar5 != (uint)rows);
    if (!bVar2) {
      MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"Expected [ ",0xb);
      uVar5 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[ ",2);
        if (0 < columns) {
          uVar9 = 0;
          do {
            poVar4 = std::ostream::_M_insert<double>
                               ((double)(*(float (*) [2])(*expected)[0])[uVar9]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            uVar9 = uVar9 + 1;
          } while (uVar6 != uVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"] ",2);
        uVar5 = uVar5 + 1;
        expected = (float (*) [2] [2])((long)expected + 8);
      } while (uVar5 != (uint)rows);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"] +/- ",6);
      poVar4 = std::ostream::_M_insert<double>((double)*tolerance);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," but was [ ",0xb);
      uVar5 = 1;
      if (1 < rows) {
        uVar5 = (ulong)(uint)rows;
      }
      uVar9 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[ ",2);
        if (0 < columns) {
          uVar7 = 0;
          do {
            poVar4 = std::ostream::_M_insert<double>((double)(*actual)[uVar9][uVar7]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            uVar7 = uVar7 + 1;
          } while (uVar6 != uVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"] ",2);
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"]",1);
      failure = MemoryOutStream::GetText((MemoryOutStream *)local_1c8);
      TestResults::OnTestFailure(results,details,failure);
      MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1c8,&MemoryOutStream::VTT);
      std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x90));
    }
  }
  return;
}

Assistant:

void CheckArray2DClose(TestResults& results, Expected const& expected, Actual const& actual,
                   int const rows, int const columns, Tolerance const& tolerance, TestDetails const& details)
{
    bool equal = true;
    for (int i = 0; i < rows; ++i)
        equal &= ArrayAreClose(expected[i], actual[i], columns, tolerance);

    if (!equal)
    {
        UnitTest::MemoryOutStream stream;

        stream << "Expected [ ";    

		for (int expectedRow = 0; expectedRow < rows; ++expectedRow)
        {
            stream << "[ ";
            for (int expectedColumn = 0; expectedColumn < columns; ++expectedColumn)
                stream << expected[expectedRow][expectedColumn] << " ";
            stream << "] ";
        }

		stream << "] +/- " << tolerance << " but was [ ";

		for (int actualRow = 0; actualRow < rows; ++actualRow)
        {
            stream << "[ ";
            for (int actualColumn = 0; actualColumn < columns; ++actualColumn)
                stream << actual[actualRow][actualColumn] << " ";
            stream << "] ";
        }

		stream << "]";

        results.OnTestFailure(details, stream.GetText());
    }
}